

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O1

bool operator<(ON_wString *lhs,wchar_t *rhs)

{
  int iVar1;
  wchar_t *string1;
  
  string1 = ON_wString::operator_cast_to_wchar_t_(lhs);
  iVar1 = ON_wString::Length(lhs);
  iVar1 = ON_StringCompareOrdinalUTF32((ON__UINT32 *)string1,iVar1,(ON__UINT32 *)rhs,-1,false);
  return SUB41((uint)iVar1 >> 0x1f,0);
}

Assistant:

bool operator<( const ON_wString& lhs, const wchar_t* rhs )
{
  const int rc = ON_wString::CompareOrdinal(
    static_cast<const wchar_t*>(lhs),
    lhs.Length(),
    rhs,
    -1,
    false
    );
  return (rc < 0);
}